

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O0

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_charset_token<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char **begin,char *end)

{
  long lVar1;
  char *pcVar2;
  char *in_RDX;
  long *in_RSI;
  char *next_1;
  char *next;
  unsigned_long in_stack_00000040;
  char *in_stack_00000048;
  char *in_stack_00000050;
  char *in_stack_00000058;
  error_type in_stack_00000060;
  bool in_stack_00000067;
  compiler_token_type local_4;
  
  switch(*(undefined1 *)*in_RSI) {
  case 0x2d:
    *in_RSI = *in_RSI + 1;
    local_4 = token_charset_hyphen;
    break;
  default:
    goto LAB_00172a5b;
  case 0x3a:
    pcVar2 = (char *)(*in_RSI + 1);
    if ((pcVar2 != in_RDX) && (*pcVar2 == ']')) {
      *in_RSI = *in_RSI + 2;
      return token_posix_charset_end;
    }
    goto LAB_00172a5b;
  case 0x5b:
    lVar1 = *in_RSI;
    pcVar2 = (char *)(lVar1 + 1);
    if (pcVar2 != in_RDX) {
      detail::ensure_(in_stack_00000067,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                      in_stack_00000048,in_stack_00000040);
      detail::ensure_(in_stack_00000067,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                      in_stack_00000048,in_stack_00000040);
      if (*pcVar2 == ':') {
        *in_RSI = lVar1 + 2;
        return token_posix_charset_begin;
      }
    }
LAB_00172a5b:
    local_4 = token_literal;
    break;
  case 0x5c:
    lVar1 = *in_RSI;
    *in_RSI = lVar1 + 1;
    if (((char *)(lVar1 + 1) == in_RDX) || (*(char *)*in_RSI != 'b')) {
      local_4 = token_escape;
    }
    else {
      *in_RSI = *in_RSI + 1;
      local_4 = token_charset_backspace;
    }
    break;
  case 0x5d:
    *in_RSI = *in_RSI + 1;
    local_4 = token_charset_end;
    break;
  case 0x5e:
    *in_RSI = *in_RSI + 1;
    local_4 = token_charset_invert;
  }
  return local_4;
}

Assistant:

regex_constants::compiler_token_type get_charset_token(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        BOOST_ASSERT(begin != end);
        switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, '^'): ++begin; return token_charset_invert;
        case BOOST_XPR_CHAR_(char_type, '-'): ++begin; return token_charset_hyphen;
        case BOOST_XPR_CHAR_(char_type, ']'): ++begin; return token_charset_end;
        case BOOST_XPR_CHAR_(char_type, '['):
            {
                FwdIter next = begin; ++next;
                if(next != end)
                {
                    BOOST_XPR_ENSURE_(
                        *next != BOOST_XPR_CHAR_(char_type, '=')
                      , error_collate
                      , "equivalence classes are not yet supported"
                    );

                    BOOST_XPR_ENSURE_(
                        *next != BOOST_XPR_CHAR_(char_type, '.')
                      , error_collate
                      , "collation sequences are not yet supported"
                    );

                    if(*next == BOOST_XPR_CHAR_(char_type, ':'))
                    {
                        begin = ++next;
                        return token_posix_charset_begin;
                    }
                }
            }
            break;
        case BOOST_XPR_CHAR_(char_type, ':'):
            {
                FwdIter next = begin; ++next;
                if(next != end && *next == BOOST_XPR_CHAR_(char_type, ']'))
                {
                    begin = ++next;
                    return token_posix_charset_end;
                }
            }
            break;
        case BOOST_XPR_CHAR_(char_type, '\\'):
            if(++begin != end)
            {
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, 'b'): ++begin; return token_charset_backspace;
                default:;
                }
            }
            return token_escape;
        default:;
        }
        return token_literal;
    }